

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# System.c
# Opt level: O2

int kwsysSystem__AppendArgument
              (char **local,char ***begin,char ***end,int *size,char *arg_local,char **arg_begin,
              char **arg_end,int *arg_size)

{
  char **__src;
  int iVar1;
  char **ppcVar2;
  char *pcVar3;
  size_t __n;
  int iVar4;
  
  iVar4 = 0;
  iVar1 = kwsysSystem__AppendByte(arg_local,arg_begin,arg_end,arg_size,'\0');
  if (iVar1 != 0) {
    ppcVar2 = *end;
    __src = *begin;
    __n = (long)ppcVar2 - (long)__src;
    iVar4 = *size;
    if ((long)iVar4 <= (long)__n >> 3) {
      ppcVar2 = (char **)malloc((long)iVar4 << 4);
      if (ppcVar2 == (char **)0x0) {
        return 0;
      }
      memcpy(ppcVar2,__src,__n);
      if (__src != local) {
        free(__src);
        iVar4 = *size;
      }
      *begin = ppcVar2;
      ppcVar2 = (char **)((long)ppcVar2 + __n);
      *end = ppcVar2;
      *size = iVar4 * 2;
    }
    pcVar3 = (char *)malloc((long)*arg_end - (long)*arg_begin);
    *ppcVar2 = pcVar3;
    iVar4 = 0;
    if (**end != (char *)0x0) {
      memcpy(**end,*arg_begin,(long)*arg_end - (long)*arg_begin);
      *end = *end + 1;
      *arg_end = *arg_begin;
      iVar4 = 1;
    }
  }
  return iVar4;
}

Assistant:

static int kwsysSystem__AppendArgument(char** local,
                                       char*** begin, char*** end,
                                       int* size,
                                       char* arg_local,
                                       char** arg_begin, char** arg_end,
                                       int* arg_size)
{
  /* Append a null-terminator to the argument string.  */
  if(!kwsysSystem__AppendByte(arg_local, arg_begin, arg_end, arg_size, '\0'))
    {
    return 0;
    }

  /* Allocate space for the argument pointer.  */
  if((*end - *begin) >= *size)
    {
    kwsysSystem_ptrdiff_t length = *end - *begin;
    char** newPointers = (char**)malloc((size_t)(*size)*2*sizeof(char*));
    if(!newPointers)
      {
      return 0;
      }
    memcpy(newPointers, *begin, (size_t)(length)*sizeof(char*));
    if(*begin != local)
      {
      free(*begin);
      }
    *begin = newPointers;
    *end = *begin + length;
    *size *= 2;
    }

  /* Allocate space for the argument string.  */
  **end = (char*)malloc((size_t)(*arg_end - *arg_begin));
  if(!**end)
    {
    return 0;
    }

  /* Store the argument in the command array.  */
  memcpy(**end, *arg_begin,(size_t)(*arg_end - *arg_begin));
  ++(*end);

  /* Reset the argument to be empty.  */
  *arg_end = *arg_begin;

  return 1;
}